

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O2

void cfd::core::logger::log<>(CfdSourceLocation *source,CfdLogLevel lvl,char *fmt)

{
  bool bVar1;
  allocator local_41;
  string local_40;
  
  bVar1 = IsEnableLogLevel(lvl);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,fmt,&local_41);
    WriteLog(source,lvl,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    cfd::core::logger::WriteLog(source, lvl, fmt);
  }
}